

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l10n.c
# Opt level: O0

void free_args(l10n_arg *args)

{
  bool bVar1;
  int local_14;
  char type;
  int i;
  l10n_arg *args_local;
  
  local_14 = 0;
  while( true ) {
    bVar1 = false;
    if (local_14 != 8) {
      bVar1 = args[local_14].name != (char *)0x0;
    }
    if (!bVar1) break;
    if (*args[local_14].name == '$') {
      free(args[local_14].value.v);
    }
    else if (*args[local_14].name == '@') {
      l10n_text_release((l10n_text *)args[local_14].value.s);
    }
    free(args[local_14].name);
    local_14 = local_14 + 1;
  }
  free(args);
  return;
}

Assistant:

static void free_args(l10n_arg args[])
{
    int i;
    for (i = 0; i != NUM_ARGS && args[i].name; ++i) {
        char type = args[i].name[0];
        switch (type) {
        case L10N_PREFIX_L10N:
            l10n_text_release((l10n_text *)args[i].value.v);
            break;
        case L10N_PREFIX_STRING:
            free(args[i].value.s);
            break;
        default:
            break;
        }
        free(args[i].name);
    }
    free(args);
}